

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_tx_cb(void *arg)

{
  long lVar1;
  long lVar2;
  short sVar3;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  if (*(short *)((long)arg + 0xa44) == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,0x1f2,"ring->count > 0");
  }
  lVar2 = (ulong)*(ushort *)((long)arg + 0xa42) * 0xb0;
  lVar1 = *(long *)((long)arg + 0xa38) + lVar2;
  if (*(char *)(*(long *)((long)arg + 0xa38) + 0xa8 + lVar2) == '\0') {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,500,"desc->submitted");
  }
  if (*(nni_msg **)(lVar1 + 0x18) != (nni_msg *)0x0) {
    nni_msg_free(*(nni_msg **)(lVar1 + 0x18));
    *(undefined8 *)(lVar1 + 0x18) = 0;
  }
  *(undefined1 *)(lVar1 + 0xa8) = 0;
  sVar3 = (short)*(undefined4 *)((long)arg + 0xa42) + 1;
  *(uint *)((long)arg + 0xa42) =
       CONCAT22((short)((uint)*(undefined4 *)((long)arg + 0xa42) >> 0x10) + -1,sVar3);
  if (sVar3 == *(short *)((long)arg + 0xa46)) {
    *(undefined2 *)((long)arg + 0xa42) = 0;
  }
  *(undefined1 *)((long)arg + 0x3e9) = 0;
  udp_start_tx((udp_ep *)arg);
  nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  return;
}

Assistant:

static void
udp_tx_cb(void *arg)
{
	udp_ep *ep = arg;

	nni_mtx_lock(&ep->mtx);
	udp_finish_tx(ep);
	nni_mtx_unlock(&ep->mtx);
}